

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caller.hpp
# Opt level: O0

PyObject * __thiscall
boost::python::detail::caller_arity<3U>::
impl<void_(*)(_object_*,_HighFreqDataType,_int),_boost::python::default_call_policies,_boost::mpl::vector4<void,__object_*,_HighFreqDataType,_int>_>
::operator()(impl<void_(*)(_object_*,_HighFreqDataType,_int),_boost::python::default_call_policies,_boost::mpl::vector4<void,__object_*,_HighFreqDataType,_int>_>
             *this,PyObject *args_,PyObject *param_3)

{
  bool bVar1;
  PyObject *p;
  first_reference pp_Var2;
  PyObject *result;
  c_t2 c2;
  c_t1 c1;
  c_t0 c0;
  argument_package inner_args;
  PyObject *in_stack_fffffffffffffe98;
  arg_from_python<HighFreqDataType> *in_stack_fffffffffffffea0;
  int local_138 [2];
  PyObject *local_130;
  arg_rvalue_from_python<int> local_120;
  undefined4 local_100;
  arg_rvalue_from_python<HighFreqDataType> local_e8;
  arg_from_python<_object_*> local_30;
  _object *local_28 [2];
  _object *local_18 [2];
  PyObject *local_8;
  
  p = get<0>(local_28);
  arg_from_python<_object_*>::arg_from_python(&local_30,p);
  bVar1 = arg_from_python<_object_*>::convertible(&local_30);
  if (bVar1) {
    get<1>(local_28);
    arg_from_python<HighFreqDataType>::arg_from_python
              (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    bVar1 = converter::arg_rvalue_from_python<HighFreqDataType>::convertible(&local_e8);
    if (bVar1) {
      get<2>(local_28);
      arg_from_python<int>::arg_from_python
                ((arg_from_python<int> *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      bVar1 = converter::arg_rvalue_from_python<int>::convertible(&local_120);
      if (bVar1) {
        compressed_pair<void_(*)(_object_*,_HighFreqDataType,_int),_boost::python::default_call_policies>
        ::second((compressed_pair<void_(*)(_object_*,_HighFreqDataType,_int),_boost::python::default_call_policies>
                  *)0x3ba310);
        bVar1 = default_call_policies::precall<_object*>(local_28);
        if (bVar1) {
          local_138[0] = create_result_converter<_object*,int>(local_18,(int *)0x0);
          pp_Var2 = compressed_pair<void_(*)(_object_*,_HighFreqDataType,_int),_boost::python::default_call_policies>
                    ::first((compressed_pair<void_(*)(_object_*,_HighFreqDataType,_int),_boost::python::default_call_policies>
                             *)0x3ba37b);
          local_130 = invoke<int,void(*)(_object*,HighFreqDataType,int),boost::python::arg_from_python<_object*>,boost::python::arg_from_python<HighFreqDataType>,boost::python::arg_from_python<int>>
                                (local_138,pp_Var2,&local_30,&local_e8,&local_120);
          compressed_pair<void_(*)(_object_*,_HighFreqDataType,_int),_boost::python::default_call_policies>
          ::second((compressed_pair<void_(*)(_object_*,_HighFreqDataType,_int),_boost::python::default_call_policies>
                    *)0x3ba3c1);
          local_8 = default_call_policies::postcall<_object*>(local_28,local_130);
        }
        else {
          local_8 = (PyObject *)0x0;
        }
      }
      else {
        local_8 = (PyObject *)0x0;
      }
      local_100 = 1;
      arg_from_python<int>::~arg_from_python((arg_from_python<int> *)0x3ba3ef);
    }
    else {
      local_8 = (PyObject *)0x0;
      local_100 = 1;
    }
    arg_from_python<HighFreqDataType>::~arg_from_python
              ((arg_from_python<HighFreqDataType> *)0x3ba3fc);
  }
  else {
    local_8 = (PyObject *)0x0;
  }
  return local_8;
}

Assistant:

PyObject* operator()(PyObject* args_, PyObject*) // eliminate
                                                         // this
                                                         // trailing
                                                         // keyword dict
        {
            typedef typename mpl::begin<Sig>::type first;
            typedef typename first::type result_t;
            typedef typename select_result_converter<Policies, result_t>::type result_converter;
            typedef typename Policies::argument_package argument_package;
            
            argument_package inner_args(args_);

# if N
#  define BOOST_PP_LOCAL_MACRO(i) BOOST_PYTHON_ARG_CONVERTER(i)
#  define BOOST_PP_LOCAL_LIMITS (0, N-1)
#  include BOOST_PP_LOCAL_ITERATE()
# endif 
            // all converters have been checked. Now we can do the
            // precall part of the policy
            if (!m_data.second().precall(inner_args))
                return 0;

            PyObject* result = detail::invoke(
                detail::invoke_tag<result_t,F>()
              , create_result_converter(args_, (result_converter*)0, (result_converter*)0)
              , m_data.first()
                BOOST_PP_ENUM_TRAILING_PARAMS(N, c)
            );
            
            return m_data.second().postcall(inner_args, result);
        }